

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

void __thiscall ON_XMLNodePrivate::MoveAfter(ON_XMLNodePrivate *this,ON_XMLNode *other)

{
  ON_XMLNodePrivate *pOVar1;
  int iVar2;
  ON_XMLNode *pOVar3;
  bool bVar4;
  
  if (this->m_node == other) {
    return;
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar2 == 0) {
    pOVar3 = PrevSibling(this);
    if (pOVar3 != other) {
      bVar4 = pOVar3 == (ON_XMLNode *)0x0;
      if (bVar4) {
        pOVar3 = this->m_parent;
      }
      (&pOVar3->_private->m_next_sibling)[(ulong)bVar4 * 2] = this->m_next_sibling;
      pOVar1 = other->_private;
      this->m_next_sibling = pOVar1->m_next_sibling;
      pOVar1->m_next_sibling = this->m_node;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void ON_XMLNodePrivate::MoveAfter(ON_XMLNode& other)
{
  if (&other == &m_node)
    return;

  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  auto* pPrev = PrevSibling();
  if (pPrev == &other)
    return;

  if (nullptr != pPrev)
  {
    pPrev->_private->m_next_sibling = m_next_sibling;
  }
  else
  {
    // 'this' was the head; redirect the parent's first child.
    m_parent->_private->m_first_child = m_next_sibling;
  }

  m_next_sibling = other._private->m_next_sibling;

  other._private->m_next_sibling = &m_node;
}